

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O3

void __thiscall
FastLinearExpert::FastLinearExpert(FastLinearExpert *this,int d,int D,Z *z,X *x,IMLE *_mixture)

{
  ZZ *this_00;
  Z *pZVar1;
  XZ *pXVar2;
  X *pXVar3;
  ZZ *this_01;
  double *pdVar4;
  double *pdVar5;
  IMLE *pIVar6;
  plainobjectbase_evaluator_data<double,_0> pVar7;
  double *pdVar8;
  undefined8 *puVar9;
  XprTypeNested pMVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  XprTypeNested rows;
  double *pdVar16;
  ulong uVar17;
  ActualDstType actualDst_4;
  long rows_00;
  ActualDstType actualDst_1;
  double dVar18;
  Scal SVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Z Sigma0;
  ActualDstType actualDst;
  Z SZ;
  ThisEvaluator thisEval;
  scalar_sum_op<double,_double> local_e9;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_e8;
  plainobjectbase_evaluator_data<double,_0> local_d8;
  undefined8 uStack_d0;
  Scal local_c8;
  undefined8 uStack_c0;
  Z *local_b8;
  plainobjectbase_evaluator_data<double,_0> local_b0;
  XprTypeNested local_a8;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_a0;
  long local_80;
  X *local_78;
  undefined1 local_70 [16];
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_60;
  scalar_constant_op<double> local_58;
  RhsNested local_48;
  
  (this->super_LinearExpert).d = d;
  (this->super_LinearExpert).D = D;
  (this->super_LinearExpert).dGamma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).dGamma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Nu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Nu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Mu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Mu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_storage.m_rows = 0;
  (this->super_LinearExpert).Lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_storage.m_cols = 0;
  (this->super_LinearExpert).invSigma.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).invSigma.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).invSigma.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).Psi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Psi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).invPsi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).invPsi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sz.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sz.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sxz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sxz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sxz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->super_LinearExpert).Szz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Szz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Szz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->super_LinearExpert).Sxx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sxx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Nu0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Nu0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).pred_x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).pred_x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).pred_z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).pred_z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  local_78 = x;
  memset(&(this->super_LinearExpert).dNewGamma,0,0x88);
  (this->super_LinearExpert).varLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).varLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).varLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).Sigma.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).Sigma.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->super_LinearExpert).Sigma.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->super_LinearExpert).PsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).PsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).PsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).LambdaPsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).LambdaPsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).LambdaPsiLambda.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).p_x_invVar.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_LinearExpert).p_x_invVar.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_LinearExpert).p_x_invVar.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_LinearExpert).recompute = true;
  (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->invSzz0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->invSzz0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->invSzz0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  this->mixture = _mixture;
  (this->super_LinearExpert).alpha = (_mixture->param).alpha;
  (this->super_LinearExpert).wPsi = (_mixture->param).wPsi;
  dVar18 = (_mixture->param).wNu;
  (this->super_LinearExpert).wNu = dVar18;
  (this->super_LinearExpert).wSigma =
       (double)d + (_mixture->param).wSigma +
       *(double *)(&DAT_0018bd10 + (ulong)(-(uint)(dVar18 == 0.0) & 1) * 8);
  (this->super_LinearExpert).wLambda = (_mixture->param).wLambda;
  local_d8.data = (double *)&(this->super_LinearExpert).Nu0;
  lVar14 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_b8 = z;
  if (lVar14 != 0) {
    pdVar8 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_d8.data,lVar14,1);
    pdVar16 = (this->super_LinearExpert).Nu0.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar13 = (this->super_LinearExpert).Nu0.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    uVar11 = uVar13 - ((long)uVar13 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar13) {
      lVar14 = 0;
      do {
        pdVar4 = pdVar8 + lVar14;
        dVar18 = pdVar4[1];
        pdVar5 = pdVar16 + lVar14;
        *pdVar5 = *pdVar4;
        pdVar5[1] = dVar18;
        lVar14 = lVar14 + 2;
      } while (lVar14 < (long)uVar11);
    }
    if ((long)uVar11 < (long)uVar13) {
      do {
        pdVar16[uVar11] = pdVar8[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
    }
  }
  pZVar1 = &(this->super_LinearExpert).Sz;
  (this->super_LinearExpert).H = 1e-06;
  (this->super_LinearExpert).Sh = 0.0;
  lVar14 = (long)d;
  if ((this->super_LinearExpert).Sz.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows != lVar14) {
    free((pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data);
    if (d < 1) {
      pdVar8 = (double *)0x0;
    }
    else {
      pdVar8 = (double *)malloc(lVar14 * 8);
      if (pdVar8 == (double *)0x0) goto LAB_0015322e;
    }
    (pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         pdVar8;
  }
  (this->super_LinearExpert).Sz.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = lVar14;
  if (0 < d) {
    memset((pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           ,0,lVar14 * 8);
  }
  rows_00 = (long)D;
  if ((this->super_LinearExpert).Sx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows != rows_00) {
    free((this->super_LinearExpert).Sx.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    if (D < 1) {
      pdVar8 = (double *)0x0;
    }
    else {
      pdVar8 = (double *)malloc(rows_00 * 8);
      if (pdVar8 == (double *)0x0) goto LAB_0015322e;
    }
    (this->super_LinearExpert).Sx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data = pdVar8;
  }
  (this->super_LinearExpert).Sx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = rows_00;
  if (0 < D) {
    memset((this->super_LinearExpert).Sx.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
           rows_00 * 8);
  }
  if ((d == 0 || D == 0) ||
     (rows_00 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar14),0))) {
    pXVar2 = &(this->super_LinearExpert).Sxz;
    local_80 = rows_00 * lVar14;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)pXVar2,local_80,rows_00,lVar14);
    lVar12 = (this->super_LinearExpert).Sxz.
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols *
             (this->super_LinearExpert).Sxz.
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    if (0 < lVar12) {
      memset((pXVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data,0,lVar12 * 8);
    }
    local_c8 = (this->super_LinearExpert).wPsi;
    uStack_c0 = 0;
    pXVar3 = &(this->super_LinearExpert).Sxx;
    pdVar8 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar13 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if ((this->super_LinearExpert).Sxx.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar13) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&pXVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar13,1);
      uVar13 = (this->super_LinearExpert).Sxx.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    }
    pdVar16 = (pXVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    uVar11 = uVar13 - ((long)uVar13 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar13) {
      lVar12 = 0;
      do {
        pdVar5 = pdVar8 + lVar12;
        dVar18 = pdVar5[1];
        pdVar4 = pdVar16 + lVar12;
        *pdVar4 = *pdVar5 * local_c8;
        pdVar4[1] = dVar18 * local_c8;
        lVar12 = lVar12 + 2;
      } while (lVar12 < (long)uVar11);
    }
    if ((long)uVar11 < (long)uVar13) {
      do {
        pdVar16[uVar11] = pdVar8[uVar11] * local_c8;
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
    }
    if ((d == 0) ||
       (lVar14 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar14),0))) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&this->invSzz,lVar14 * lVar14,lVar14,lVar14)
      ;
      auVar22 = _DAT_0018a020;
      auVar21 = _DAT_0018a010;
      pdVar8 = (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      lVar12 = (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      uVar13 = (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols;
      if (0 < (long)uVar13) {
        lVar15 = lVar12 + -1;
        auVar20._8_4_ = (int)lVar15;
        auVar20._0_8_ = lVar15;
        auVar20._12_4_ = (int)((ulong)lVar15 >> 0x20);
        pdVar16 = pdVar8 + 1;
        uVar11 = 0;
        auVar20 = auVar20 ^ _DAT_0018a020;
        do {
          if (0 < lVar12) {
            uVar17 = 0;
            auVar23 = auVar21;
            do {
              auVar24 = auVar23 ^ auVar22;
              if ((bool)(~(auVar20._4_4_ < auVar24._4_4_ ||
                          auVar20._0_4_ < auVar24._0_4_ && auVar24._4_4_ == auVar20._4_4_) & 1)) {
                dVar18 = 1.0;
                if (uVar11 != uVar17) {
                  dVar18 = 0.0;
                }
                pdVar16[uVar17 - 1] = dVar18;
              }
              if (auVar24._12_4_ <= auVar20._12_4_ &&
                  (auVar24._8_4_ <= auVar20._8_4_ || auVar24._12_4_ != auVar20._12_4_)) {
                dVar18 = 1.0;
                if (uVar11 - 1 != uVar17) {
                  dVar18 = 0.0;
                }
                pdVar16[uVar17] = dVar18;
              }
              uVar17 = uVar17 + 2;
              lVar15 = auVar23._8_8_;
              auVar23._0_8_ = auVar23._0_8_ + 2;
              auVar23._8_8_ = lVar15 + 2;
            } while ((lVar12 + 1U & 0xfffffffffffffffe) != uVar17);
          }
          uVar11 = uVar11 + 1;
          pdVar16 = pdVar16 + lVar12;
        } while (uVar11 != uVar13);
      }
      dVar18 = (this->super_LinearExpert).wLambda;
      lVar12 = uVar13 * lVar12;
      uVar13 = lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < lVar12) {
        auVar21._8_8_ = dVar18;
        auVar21._0_8_ = dVar18;
        lVar15 = 0;
        do {
          auVar22 = divpd(*(undefined1 (*) [16])(pdVar8 + lVar15),auVar21);
          *(undefined1 (*) [16])(pdVar8 + lVar15) = auVar22;
          lVar15 = lVar15 + 2;
        } while (lVar15 < (long)uVar13);
      }
      if ((long)uVar13 < lVar12) {
        do {
          pdVar8[uVar13] = pdVar8[uVar13] / dVar18;
          uVar13 = uVar13 + 1;
        } while (lVar12 - uVar13 != 0);
      }
      pIVar6 = this->mixture;
      local_c8 = (pIVar6->param).wSigma;
      uStack_c0 = 0;
      local_e8.m_storage.m_data = (double *)0x0;
      local_e8.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&local_e8,
                 (pIVar6->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows,1);
      pdVar8 = (pIVar6->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      rows = (XprTypeNested)
             (pIVar6->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
      if ((XprTypeNested)local_e8.m_storage.m_rows != rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_e8,(Index)rows,1);
        rows = (XprTypeNested)local_e8.m_storage.m_rows;
      }
      pMVar10 = (XprTypeNested)((long)rows - ((long)rows >> 0x3f) & 0xfffffffffffffffe);
      if (1 < (long)rows) {
        lVar12 = 0;
        do {
          pdVar16 = pdVar8 + lVar12;
          dVar18 = pdVar16[1];
          *(double *)((long)local_e8.m_storage.m_data + lVar12 * 8) = *pdVar16 * local_c8;
          *(double *)
           ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
            ((long)local_e8.m_storage.m_data + lVar12 * 8) + 8) = dVar18 * local_c8;
          lVar12 = lVar12 + 2;
        } while (lVar12 < (long)pMVar10);
      }
      if ((long)pMVar10 < (long)rows) {
        do {
          *(double *)((long)local_e8.m_storage.m_data + (long)pMVar10 * 8) =
               pdVar8[(long)pMVar10] * local_c8;
          pMVar10 = (XprTypeNested)
                    ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            ).m_storage.m_data + 1);
        } while (rows != pMVar10);
      }
      local_70._8_8_ = &local_e8;
      if (((XprTypeNested)local_e8.m_storage.m_rows != (XprTypeNested)0x0) &&
         (auVar21 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
         SUB168(auVar21 / SEXT816(local_e8.m_storage.m_rows),0) < local_e8.m_storage.m_rows)) {
        puVar9 = (undefined8 *)
                 __cxa_allocate_exception
                           (8,rows,SUB168(auVar21 % SEXT816(local_e8.m_storage.m_rows),0));
        *puVar9 = operator_delete;
        __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      this_01 = &this->invSzz0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this_01,
                 local_e8.m_storage.m_rows * local_e8.m_storage.m_rows,local_e8.m_storage.m_rows,
                 local_e8.m_storage.m_rows);
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Diagonal2Dense,_void>
      ::run(this_01,(DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)local_70,(assign_op<double,_double> *)&local_a0);
      pVar7.data = local_d8.data;
      local_70._8_8_ = local_d8.data;
      local_70._0_8_ = this_01;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_b0,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)local_70);
      local_a0.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d._0_8_ = pVar7.data;
      local_a0.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
           (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
           (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)&local_b0;
      if (local_a8 == (XprTypeNested)0x0) {
        local_d8.data = (double *)0x0;
        local_a8 = (XprTypeNested)0x0;
      }
      else {
        local_70._8_8_ = *pVar7.data;
        local_60.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (plainobjectbase_evaluator_data<double,_0>)local_b0.data;
        local_d8.data =
             (double *)
             Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_70,&local_e9,
                        (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)&local_a0);
      }
      local_58.m_other = 1.0 / (this->super_LinearExpert).wNu + (double)local_d8.data;
      local_70._0_8_ = &local_b0;
      local_70._8_8_ = local_a8;
      local_48.m_matrix = (non_const_type)&local_b0;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,0>,Eigen::internal::sub_assign_op<double,double>>
                (this_01,(Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
                          *)local_70,(sub_assign_op<double,_double> *)&local_a0,(type)0x0);
      dVar18 = 1.0;
      if ((XprTypeNested)local_e8.m_storage.m_rows != (XprTypeNested)0x0) {
        local_70._0_8_ = local_e8.m_storage.m_data;
        dVar18 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
                 ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                           ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_70,
                            (scalar_product_op<double,_double> *)&local_a0,
                            (Matrix<double,__1,_1,_0,__1,_1> *)&local_e8);
      }
      pZVar1 = &(this->super_LinearExpert).Nu;
      this->detInvSzz0 =
           (1.0 / dVar18) / ((double)local_d8.data * (this->super_LinearExpert).wNu + 1.0);
      pdVar8 = (local_b8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      uVar13 = (local_b8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
      if ((this->super_LinearExpert).Nu.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar13)
      {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar13,1)
        ;
        uVar13 = (this->super_LinearExpert).Nu.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      pdVar16 = (pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      uVar11 = uVar13 - ((long)uVar13 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar13) {
        lVar12 = 0;
        do {
          pdVar4 = pdVar8 + lVar12;
          dVar18 = pdVar4[1];
          pdVar5 = pdVar16 + lVar12;
          *pdVar5 = *pdVar4;
          pdVar5[1] = dVar18;
          lVar12 = lVar12 + 2;
        } while (lVar12 < (long)uVar11);
      }
      if ((long)uVar11 < (long)uVar13) {
        do {
          pdVar16[uVar11] = pdVar8[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
      pXVar3 = &(this->super_LinearExpert).Mu;
      pdVar8 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      uVar13 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
      if ((this->super_LinearExpert).Mu.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar13)
      {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&pXVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar13,1)
        ;
        uVar13 = (this->super_LinearExpert).Mu.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      pdVar16 = (pXVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      uVar11 = uVar13 - ((long)uVar13 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar13) {
        lVar12 = 0;
        do {
          pdVar4 = pdVar8 + lVar12;
          dVar18 = pdVar4[1];
          pdVar5 = pdVar16 + lVar12;
          *pdVar5 = *pdVar4;
          pdVar5[1] = dVar18;
          lVar12 = lVar12 + 2;
        } while (lVar12 < (long)uVar11);
      }
      if ((long)uVar11 < (long)uVar13) {
        do {
          pdVar16[uVar11] = pdVar8[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
      if ((d != 0 && D != 0) &&
         (auVar21 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
         SUB168(auVar21 / SEXT816(lVar14),0) < rows_00)) {
        puVar9 = (undefined8 *)
                 __cxa_allocate_exception(8,uVar13,SUB168(auVar21 % SEXT816(lVar14),0));
        *puVar9 = operator_delete;
        __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pXVar2 = &(this->super_LinearExpert).Lambda;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)pXVar2,local_80,rows_00,lVar14);
      lVar14 = (this->super_LinearExpert).Lambda.
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols *
               (this->super_LinearExpert).Lambda.
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      if (0 < lVar14) {
        memset((pXVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data,0,lVar14 * 8);
      }
      local_48.m_matrix = (non_const_type)(this->super_LinearExpert).wSigma;
      local_58.m_other = (double)local_e8.m_storage.m_rows;
      local_60.m_d.data =
           (plainobjectbase_evaluator_data<double,_0>)
           (plainobjectbase_evaluator_data<double,_0>)&local_e8;
      if (((XprTypeNested)local_e8.m_storage.m_rows != (XprTypeNested)0x0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                 SEXT816(local_e8.m_storage.m_rows),0) < local_e8.m_storage.m_rows)) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar9 = operator_delete;
        __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      this_00 = &(this->super_LinearExpert).invSigma;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this_00,
                 local_e8.m_storage.m_rows * local_e8.m_storage.m_rows,local_e8.m_storage.m_rows,
                 local_e8.m_storage.m_rows);
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Diagonal2Dense,_void>
      ::run(this_00,(DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                     *)local_70,(assign_op<double,_double> *)&local_a0);
      local_58.m_other = (this->super_LinearExpert).wSigma;
      local_70._8_8_ = local_e8.m_storage.m_rows;
      dVar18 = 1.0;
      local_70._0_8_ = &local_e8;
      if ((XprTypeNested)local_e8.m_storage.m_rows != (XprTypeNested)0x0) {
        local_a0.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_e8.m_storage.m_data;
        local_a0.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .m_functor.m_other = local_58.m_other;
        dVar18 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                 ::
                 run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                           (&local_a0,(scalar_product_op<double,_double> *)&local_e9,
                            (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             *)local_70);
      }
      dVar18 = 1.0 / dVar18;
      if (dVar18 < 0.0) {
        SVar19 = sqrt(dVar18);
      }
      else {
        SVar19 = SQRT(dVar18);
      }
      (this->super_LinearExpert).sqrtDetInvSigma = SVar19;
      local_d8.data = (double *)(2.0 / (this->super_LinearExpert).wPsi);
      uStack_d0 = 0;
      pdVar8 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      uVar13 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
      pXVar3 = &(this->super_LinearExpert).Psi;
      if ((this->super_LinearExpert).Psi.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar13)
      {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&pXVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar13,1)
        ;
        uVar13 = (this->super_LinearExpert).Psi.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      auVar22._0_8_ = (double)local_d8.data + 1.0;
      pdVar16 = (pXVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      uVar11 = uVar13 - ((long)uVar13 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar13) {
        auVar22._8_8_ = auVar22._0_8_;
        lVar14 = 0;
        do {
          auVar21 = divpd(*(undefined1 (*) [16])(pdVar8 + lVar14),auVar22);
          *(undefined1 (*) [16])(pdVar16 + lVar14) = auVar21;
          lVar14 = lVar14 + 2;
        } while (lVar14 < (long)uVar11);
      }
      if ((long)uVar11 < (long)uVar13) {
        do {
          pdVar16[uVar11] = pdVar8[uVar11] / auVar22._0_8_;
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
      pXVar3 = &(this->super_LinearExpert).invPsi;
      pdVar8 = (this->super_LinearExpert).Psi.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar13 = (this->super_LinearExpert).Psi.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_d8.data = (double *)auVar22._0_8_;
      if ((this->super_LinearExpert).invPsi.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar13)
      {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&pXVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar13,1)
        ;
        uVar13 = (this->super_LinearExpert).invPsi.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      auVar21 = _DAT_0018bd00;
      pdVar16 = (pXVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      uVar11 = uVar13 - ((long)uVar13 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar13) {
        lVar14 = 0;
        do {
          auVar22 = divpd(auVar21,*(undefined1 (*) [16])(pdVar8 + lVar14));
          *(undefined1 (*) [16])(pdVar16 + lVar14) = auVar22;
          lVar14 = lVar14 + 2;
        } while (lVar14 < (long)uVar11);
      }
      if ((long)uVar11 < (long)uVar13) {
        do {
          pdVar16[uVar11] = 1.0 / pdVar8[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
      if ((this->super_LinearExpert).invPsi.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 0) {
        dVar18 = 1.0;
      }
      else {
        local_70._0_8_ =
             (pXVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        dVar18 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
                 ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                           ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_70,
                            (scalar_product_op<double,_double> *)&local_a0,pXVar3);
      }
      if (dVar18 < 0.0) {
        SVar19 = sqrt(dVar18);
      }
      else {
        SVar19 = SQRT(dVar18);
      }
      (this->super_LinearExpert).sqrtDetInvPsi = SVar19;
      (this->super_LinearExpert).recompute = true;
      free(local_b0.data);
      free(local_e8.m_storage.m_data);
      return;
    }
  }
LAB_0015322e:
  puVar9 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar9 = operator_delete;
  __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

FAST_LINEAR_EXPERT_base::FastLinearExpert(Z const &z, X const &x, IMLE<d,D,::FastLinearExpert> *_mixture)
#endif
{
    mixture = _mixture;

    alpha = mixture->getParameters().alpha;
    wPsi = mixture->getParameters().wPsi;
    wNu = mixture->getParameters().wNu;
    wSigma = mixture->getParameters().wSigma + d + ((wNu==0) ? 1.0 : 2.0);
    wLambda = mixture->getParameters().wLambda;

    Nu0 = z;


    H = EPSILON;

    Sh = 0.0;
    Sz.setZero(d);
    Sx.setZero(D);
    Sxz.setZero(D,d);
    Sxx = wPsi * mixture->getPsi();
//Sxx = X::Zero(D);
    invSzz.setIdentity(d,d) /= wLambda;
    Z Sigma0 = mixture->getParameters().wSigma*mixture->getSigma();
    invSzz0 = Sigma0.cwiseInverse().asDiagonal();
	// Using Moore-Penrose Rank-1 update
	Z SZ = invSzz0 * Nu0;
	Scal DOT = Nu0.dot(SZ);
	Scal DEN = DOT + 1 / wNu;
	invSzz0 -= (SZ/DEN) * SZ.transpose();

	// Using Determinant Rank-1 update
	detInvSzz0 = 1.0 / Sigma0.prod();
	detInvSzz0 /= (DOT*wNu + 1.0);

    Nu = z;
    Mu = x;
    Lambda.setZero(D,d);
    invSigma = (Sigma0/wSigma).cwiseInverse().asDiagonal();
    sqrtDetInvSigma = sqrt( 1.0 / (Sigma0/wSigma).prod() );

    Psi = mixture->getPsi() / (1.0 + 2.0/wPsi) ;
    invPsi = Psi.cwiseInverse();
    sqrtDetInvPsi = sqrt(invPsi.prod());

//    invSzz.setIdentity(d,d) /= EPSILON;
//    invSzz0.setIdentity(d,d) /= this->w0 * this->sigma;
//    detInvSzz0 = 1.0 / pow(this->w0 * this->sigma, d);
//
//    this->Nu = z;
//    this->Mu = x;
//    this->Lambda.setZero(D,d);
//    this->invSSEzz.setZero(d,d);
//
//    this->invSigma.setIdentity(d,d) *=  (this->w0+d+1.0)/(this->w0*this->sigma);
//    this->sqrtDetInvSigma = pow((this->w0+d+1.0)/(this->w0*this->sigma), d/2.0);
//
//    this->recompute = true;
    recompute = true;
}